

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

void Mf_ManComputeMapping(Mf_Man_t *p)

{
  uint *__src;
  ushort uVar1;
  uint uVar2;
  int iVar3;
  Mf_Obj_t *pMVar4;
  Jf_Par_t *pJVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint *puVar14;
  ulong uVar15;
  char *pTitle;
  uint uVar16;
  ulong uVar17;
  uint *pCut;
  ushort uVar18;
  short sVar19;
  uint *pCut_00;
  float fVar20;
  float fVar21;
  undefined1 local_338 [776];
  
  pGVar9 = p->pGia;
  if (0 < pGVar9->nObjs) {
    uVar17 = 0;
    do {
      if ((~*(uint *)(pGVar9->pObjs + uVar17) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(pGVar9->pObjs + uVar17)) {
        pMVar4 = p->pLfObjs;
        uVar10 = pMVar4[uVar17].iCutSet >> 0x10;
        if (((int)uVar10 < 0) || ((p->vPages).nSize <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar7 = -1;
        puVar14 = (uint *)((ulong)((pMVar4[uVar17].iCutSet & 0xffffU) << 2) +
                          (long)(p->vPages).pArray[uVar10]);
        if ((p->fUseEla != 0) && (0xffff < *(uint *)&pMVar4[uVar17].field_0xc)) {
          iVar7 = Mf_CutDeref_rec(p,(int *)(puVar14 + 1));
        }
        __src = puVar14 + 1;
        uVar10 = 1000000000;
        if ((int)*puVar14 < 1) {
          pCut_00 = (uint *)0x0;
          fVar21 = 1e+09;
        }
        else {
          iVar13 = 0;
          fVar21 = 1e+09;
          pCut_00 = (uint *)0x0;
          uVar16 = 0;
          pCut = __src;
          do {
            uVar2 = *pCut;
            uVar11 = uVar2 & 0x1f;
            if ((uVar11 == 1) && (uVar17 == pCut[1])) {
              __assert_fail("!Mf_CutIsTriv(pCut, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                            ,0x64f,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
            }
            pJVar5 = p->pPars;
            if (pJVar5->nLutSize < (int)uVar11) {
              __assert_fail("Mf_CutSize(pCut) <= p->pPars->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                            ,0x650,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
            }
            if (p->fUseEla == 0) {
              if (uVar11 == 0) {
                uVar16 = 1;
                fVar20 = 0.0;
              }
              else {
                fVar20 = 0.0;
                uVar15 = 0;
                uVar16 = 0;
                do {
                  uVar18 = *(ushort *)&p->pLfObjs[(int)pCut[uVar15 + 1]].field_0xc;
                  uVar6 = (uint)uVar18;
                  if (uVar18 < uVar16) {
                    uVar6 = uVar16;
                  }
                  uVar16 = uVar6;
                  fVar20 = fVar20 + p->pLfObjs[(int)pCut[uVar15 + 1]].Flow;
                  uVar15 = uVar15 + 1;
                } while ((uVar2 & 0x1f) != uVar15);
                uVar16 = uVar16 + 1;
              }
              iVar8 = 0;
              if (1 < uVar11) {
                if (pJVar5->fGenCnf == 0) {
                  if (pJVar5->fOptEdge == 0) {
                    iVar8 = 1;
                  }
                  else {
                    iVar8 = uVar11 + pJVar5->nAreaTuner;
                  }
                }
                else {
                  if ((p->vCnfSizes).nSize <= (int)(uVar2 >> 6)) goto LAB_0076ff33;
                  iVar8 = (p->vCnfSizes).pArray[uVar2 >> 6];
                }
              }
              fVar20 = fVar20 + (float)iVar8;
            }
            else {
              (p->vTemp).nSize = 0;
              iVar8 = Mf_CutRef2_rec(p,(int *)pCut,&p->vTemp,8);
              if (0 < (p->vTemp).nSize) {
                lVar12 = 0;
                do {
                  iVar3 = (p->vTemp).pArray[lVar12];
                  *(short *)&p->pLfObjs[iVar3].field_0xe =
                       (short)((uint)*(ushort *)&p->pLfObjs[iVar3].field_0xe * 0x10000 + -0x10000 >>
                              0x10);
                  lVar12 = lVar12 + 1;
                } while (lVar12 < (p->vTemp).nSize);
              }
              fVar20 = (float)iVar8;
            }
            if (((pCut_00 == (uint *)0x0) || (fVar20 + 0.005 < fVar21)) ||
               ((fVar20 + -0.005 < fVar21 && (uVar16 < uVar10)))) {
              pCut_00 = pCut;
              fVar21 = fVar20;
              uVar10 = uVar16;
            }
            iVar13 = iVar13 + 1;
            pCut = pCut + (ulong)(*pCut & 0x1f) + 1;
          } while (iVar13 < (int)*puVar14);
        }
        sVar19 = (short)uVar10;
        if (pCut_00 == (uint *)0x0) {
          __assert_fail("pCutBest != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                        ,0x655,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
        }
        if ((p->fUseEla == 0) || (*(uint *)&pMVar4[uVar17].field_0xc < 0x10000)) {
          *(uint *)&pMVar4[uVar17].field_0xc = (uint)*(ushort *)&pMVar4[uVar17].field_0xc;
        }
        else {
          iVar7 = Mf_CutRef_rec(p,(int *)pCut_00);
        }
        if (iVar7 < -1) {
          __assert_fail("Value1 >= Value2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                        ,0x65a,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
        }
        if (p->fUseEla != 0) {
          uVar10 = *pCut_00 & 0x1f;
          if (uVar10 == 0) {
            sVar19 = 1;
          }
          else {
            uVar15 = 0;
            uVar18 = 0;
            do {
              uVar1 = *(ushort *)&p->pLfObjs[(int)pCut_00[uVar15 + 1]].field_0xc;
              if (uVar1 < uVar18) {
                uVar1 = uVar18;
              }
              uVar18 = uVar1;
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
            sVar19 = uVar18 + 1;
          }
          if (((1 < uVar10) && (p->pPars->fGenCnf != 0)) &&
             ((p->vCnfSizes).nSize <= (int)(*pCut_00 >> 6))) {
LAB_0076ff33:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
        }
        *(short *)&pMVar4[uVar17].field_0xc = sVar19;
        pMVar4[uVar17].Flow = fVar21 / p->pLfObjs[uVar17].nFlowRefs;
        if (pCut_00 <= puVar14) {
          __assert_fail("pCuts < pCut",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                        ,0x2ef,"void Mf_ObjSetBestCut(int *, int *)");
        }
        if (__src < pCut_00) {
          uVar10 = *pCut_00;
          uVar15 = ((long)pCut_00 - (long)__src) * 0x40000000 >> 0x1e & 0xfffffffffffffffc;
          memcpy(local_338,__src,uVar15);
          memmove(__src,pCut_00,(ulong)(uVar10 & 0x1f) * 4 + 4);
          memcpy(__src + (ulong)(uVar10 & 0x1f) + 1,local_338,uVar15);
        }
      }
      uVar17 = uVar17 + 1;
      pGVar9 = p->pGia;
    } while ((long)uVar17 < (long)pGVar9->nObjs);
  }
  Mf_ManSetMapRefs(p);
  if (p->fUseEla == 0) {
    pTitle = "Area ";
    if (p->Iter == 0) {
      pTitle = "Delay";
    }
  }
  else {
    pTitle = "Ela  ";
  }
  Mf_ManPrintStats(p,pTitle);
  return;
}

Assistant:

void Mf_ManComputeMapping( Mf_Man_t * p )
{
    int i;
    Gia_ManForEachAndId( p->pGia, i )
        Mf_ObjComputeBestCut( p, i );
    Mf_ManSetMapRefs( p );
    Mf_ManPrintStats( p, (char *)(p->fUseEla ? "Ela  " : (p->Iter ? "Area " : "Delay")) );
}